

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui_qprintsettingsoutput.h
# Opt level: O2

void __thiscall
Ui_QPrintSettingsOutput::retranslateUi(Ui_QPrintSettingsOutput *this,QWidget *QPrintSettingsOutput)

{
  QGroupBox *pQVar1;
  QRadioButton *pQVar2;
  QLabel *pQVar3;
  QLineEdit *pQVar4;
  QCheckBox *pQVar5;
  QWidget *pQVar6;
  uint uVar7;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QCoreApplication::translate((char *)&local_50,"QPrintSettingsOutput","Form",0);
  QWidget::setWindowTitle((QString *)QPrintSettingsOutput);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  pQVar1 = this->gbPrintRange;
  QCoreApplication::translate((char *)&local_50,"QPrintSettingsOutput","Print range",0);
  QGroupBox::setTitle((QString *)pQVar1);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  pQVar2 = this->printAll;
  QCoreApplication::translate((char *)&local_50,"QPrintSettingsOutput","Print all",0);
  QAbstractButton::setText((QString *)pQVar2);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  pQVar2 = this->printRange;
  QCoreApplication::translate((char *)&local_50,"QPrintSettingsOutput","Pages from",0);
  QAbstractButton::setText((QString *)pQVar2);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  pQVar3 = this->label_3;
  QCoreApplication::translate((char *)&local_50,"QPrintSettingsOutput","to",0);
  QLabel::setText((QString *)pQVar3);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  pQVar2 = this->pagesRadioButton;
  QCoreApplication::translate((char *)&local_50,"QPrintSettingsOutput","Pages",0);
  QAbstractButton::setText((QString *)pQVar2);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  pQVar4 = this->pagesLineEdit;
  QCoreApplication::translate
            ((char *)&local_50,"QPrintSettingsOutput",
             "Specify pages or ranges separated by commas. Ranges are specified by two numbers separated by a hyphen. E.g: 3,5-7,9 prints pages 3, 5, 6, 7 and 9."
             ,0);
  QWidget::setToolTip((QString *)pQVar4);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  pQVar2 = this->printCurrentPage;
  QCoreApplication::translate((char *)&local_50,"QPrintSettingsOutput","Current Page",0);
  QAbstractButton::setText((QString *)pQVar2);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  pQVar2 = this->printSelection;
  QCoreApplication::translate((char *)&local_50,"QPrintSettingsOutput","Selection",0);
  QAbstractButton::setText((QString *)pQVar2);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  pQVar3 = this->pageSetLabel;
  QCoreApplication::translate((char *)&local_50,"QPrintSettingsOutput","Page Set:",0);
  QLabel::setText((QString *)pQVar3);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  pQVar1 = this->groupBox;
  QCoreApplication::translate((char *)&local_50,"QPrintSettingsOutput","Output Settings",0);
  QGroupBox::setTitle((QString *)pQVar1);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  pQVar3 = this->label;
  QCoreApplication::translate((char *)&local_50,"QPrintSettingsOutput","Copies:",0);
  QLabel::setText((QString *)pQVar3);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  pQVar5 = this->collate;
  QCoreApplication::translate((char *)&local_50,"QPrintSettingsOutput","Collate",0);
  QAbstractButton::setText((QString *)pQVar5);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  pQVar5 = this->reverse;
  QCoreApplication::translate((char *)&local_50,"QPrintSettingsOutput","Reverse",0);
  QAbstractButton::setText((QString *)pQVar5);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  pQVar6 = (QWidget *)this->tabs;
  uVar7 = QTabWidget::indexOf(pQVar6);
  QCoreApplication::translate((char *)&local_50,"QPrintSettingsOutput","Copies",0);
  QTabWidget::setTabText((int)pQVar6,(QString *)(ulong)uVar7);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  pQVar1 = this->colorMode;
  QCoreApplication::translate((char *)&local_50,"QPrintSettingsOutput","Color Mode",0);
  QGroupBox::setTitle((QString *)pQVar1);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  pQVar2 = this->color;
  QCoreApplication::translate((char *)&local_50,"QPrintSettingsOutput","Color",0);
  QAbstractButton::setText((QString *)pQVar2);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  pQVar2 = this->grayscale;
  QCoreApplication::translate((char *)&local_50,"QPrintSettingsOutput","Grayscale",0);
  QAbstractButton::setText((QString *)pQVar2);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  pQVar1 = this->duplex;
  QCoreApplication::translate((char *)&local_50,"QPrintSettingsOutput","Double Sided Printing",0);
  QGroupBox::setTitle((QString *)pQVar1);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  pQVar2 = this->noDuplex;
  QCoreApplication::translate((char *)&local_50,"QPrintSettingsOutput","Off",0);
  QAbstractButton::setText((QString *)pQVar2);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  pQVar2 = this->duplexLong;
  QCoreApplication::translate((char *)&local_50,"QPrintSettingsOutput","Long side binding",0);
  QAbstractButton::setText((QString *)pQVar2);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  pQVar2 = this->duplexShort;
  QCoreApplication::translate((char *)&local_50,"QPrintSettingsOutput","Short side binding",0);
  QAbstractButton::setText((QString *)pQVar2);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  pQVar6 = (QWidget *)this->tabs;
  uVar7 = QTabWidget::indexOf(pQVar6);
  QCoreApplication::translate((char *)&local_50,"QPrintSettingsOutput","Options",0);
  QTabWidget::setTabText((int)pQVar6,(QString *)(ulong)uVar7);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void retranslateUi(QWidget *QPrintSettingsOutput)
    {
        QPrintSettingsOutput->setWindowTitle(QCoreApplication::translate("QPrintSettingsOutput", "Form", nullptr));
        gbPrintRange->setTitle(QCoreApplication::translate("QPrintSettingsOutput", "Print range", nullptr));
        printAll->setText(QCoreApplication::translate("QPrintSettingsOutput", "Print all", nullptr));
        printRange->setText(QCoreApplication::translate("QPrintSettingsOutput", "Pages from", nullptr));
        label_3->setText(QCoreApplication::translate("QPrintSettingsOutput", "to", nullptr));
        pagesRadioButton->setText(QCoreApplication::translate("QPrintSettingsOutput", "Pages", nullptr));
#if QT_CONFIG(tooltip)
        pagesLineEdit->setToolTip(QCoreApplication::translate("QPrintSettingsOutput", "Specify pages or ranges separated by commas. Ranges are specified by two numbers separated by a hyphen. E.g: 3,5-7,9 prints pages 3, 5, 6, 7 and 9.", nullptr));
#endif // QT_CONFIG(tooltip)
        printCurrentPage->setText(QCoreApplication::translate("QPrintSettingsOutput", "Current Page", nullptr));
        printSelection->setText(QCoreApplication::translate("QPrintSettingsOutput", "Selection", nullptr));
        pageSetLabel->setText(QCoreApplication::translate("QPrintSettingsOutput", "Page Set:", nullptr));
        groupBox->setTitle(QCoreApplication::translate("QPrintSettingsOutput", "Output Settings", nullptr));
        label->setText(QCoreApplication::translate("QPrintSettingsOutput", "Copies:", nullptr));
        collate->setText(QCoreApplication::translate("QPrintSettingsOutput", "Collate", nullptr));
        reverse->setText(QCoreApplication::translate("QPrintSettingsOutput", "Reverse", nullptr));
        tabs->setTabText(tabs->indexOf(copiesTab), QCoreApplication::translate("QPrintSettingsOutput", "Copies", nullptr));
        colorMode->setTitle(QCoreApplication::translate("QPrintSettingsOutput", "Color Mode", nullptr));
        color->setText(QCoreApplication::translate("QPrintSettingsOutput", "Color", nullptr));
        grayscale->setText(QCoreApplication::translate("QPrintSettingsOutput", "Grayscale", nullptr));
        duplex->setTitle(QCoreApplication::translate("QPrintSettingsOutput", "Double Sided Printing", nullptr));
        noDuplex->setText(QCoreApplication::translate("QPrintSettingsOutput", "Off", nullptr));
        duplexLong->setText(QCoreApplication::translate("QPrintSettingsOutput", "Long side binding", nullptr));
        duplexShort->setText(QCoreApplication::translate("QPrintSettingsOutput", "Short side binding", nullptr));
        tabs->setTabText(tabs->indexOf(optionsTab), QCoreApplication::translate("QPrintSettingsOutput", "Options", nullptr));
    }